

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEmbed.c
# Opt level: O3

void Emb_ManDumpGnuplot(Emb_Man_t *p,char *pName,int fDumpLarge,int fShowImage)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  int *__ptr;
  int iVar4;
  char *pcVar5;
  FILE *__stream;
  Vec_Int_t *__ptr_00;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  ulong uVar9;
  char Buffer [1000];
  
  if (p->pPlacement == (unsigned_short *)0x0) {
    puts("Emb_ManDumpGnuplot(): Placement is not available.");
    return;
  }
  pcVar5 = Gia_FileNameGenericAppend(pName,".plt");
  sprintf(Buffer,"%s%s","",pcVar5);
  __stream = fopen(Buffer,"w");
  pcVar5 = Ioa_TimeStamp();
  fprintf(__stream,"# This Gnuplot file was produced by ABC on %s\n",pcVar5);
  fputc(10,__stream);
  fwrite("set nokey\n",10,1,__stream);
  fputc(10,__stream);
  if (fShowImage == 0) {
    fwrite("set terminal gif font \'arial\' 10 size 800,600 xffffff x000000 x000000 x000000\n",0x4e,
           1,__stream);
    pcVar5 = Gia_FileNameGenericAppend(pName,".gif");
    fprintf(__stream,"set output \'%s\'\n",pcVar5);
    fputc(10,__stream);
  }
  uVar7 = p->nRegs;
  iVar4 = p->vCis->nSize;
  iVar2 = p->vCos->nSize;
  uVar3 = p->nObjs;
  Emb_ManComputeHPWL(p);
  fprintf(__stream,
          "set title \"%s :  PI = %d   PO = %d   FF = %d   Node = %d   Obj = %d  HPWL = %.2e\\n",
          pName,(ulong)(iVar4 - uVar7),(ulong)(iVar2 - uVar7),(ulong)uVar7,
          (ulong)(uVar3 - (iVar2 + iVar4)),(ulong)uVar3);
  pcVar5 = Ioa_TimeStamp();
  fprintf(__stream,"(image generated by ABC and Gnuplot on %s)\"",pcVar5);
  fwrite("font \"Times, 12\"\n",0x11,1,__stream);
  fputc(10,__stream);
  fwrite("plot [:] \'-\' w l\n",0x11,1,__stream);
  fputc(10,__stream);
  if (fDumpLarge == 0) {
    iVar4 = p->nObjData;
    if (0 < iVar4) {
      uVar9 = 0;
      do {
        if (p->pObjData == (int *)0x0) break;
        puVar1 = (uint *)(p->pObjData + uVar9);
        uVar7 = puVar1[1];
        if (0 < (int)uVar7 && puVar1[3] == p->nTravIds) {
          lVar6 = 0;
          do {
            uVar7 = puVar1[(ulong)(*puVar1 >> 4) + lVar6 + 5];
            if (puVar1[(long)(int)uVar7 + 3] != p->nTravIds) {
              __assert_fail("Emb_ObjIsTravIdCurrent(p, pNext)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEmbed.c"
                            ,0x6da,"void Emb_ManDumpGnuplot(Emb_Man_t *, char *, int, int)");
            }
            fprintf(__stream,"%5d %5d\n",(ulong)p->pPlacement[puVar1[4] * 2],
                    (ulong)p->pPlacement[(ulong)(puVar1[4] * 2) + 1]);
            fprintf(__stream,"%5d %5d\n",(ulong)p->pPlacement[puVar1[(long)(int)uVar7 + 4] * 2],
                    (ulong)p->pPlacement[(ulong)(puVar1[(long)(int)uVar7 + 4] * 2) + 1]);
            fputc(10,__stream);
            uVar7 = puVar1[1];
            lVar6 = lVar6 + 1;
          } while ((int)lVar6 < (int)uVar7);
          iVar4 = p->nObjData;
        }
        uVar7 = (int)uVar9 + (*puVar1 >> 4) + uVar7 + 5;
        uVar9 = (ulong)uVar7;
      } while ((int)uVar7 < iVar4);
    }
    goto LAB_0072dcc7;
  }
  __ptr_00 = Emb_ManDumpGnuplotPrepare(p);
  iVar4 = __ptr_00->nSize;
  uVar9 = (ulong)iVar4;
  __ptr = __ptr_00->pArray;
  if ((long)uVar9 < 1) {
    if (__ptr != (int *)0x0) goto LAB_0072dcb4;
  }
  else {
    uVar8 = 1;
    do {
      if (((uVar9 <= uVar8) || (uVar9 <= uVar8 + 1)) || (uVar9 <= uVar8 + 2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar7 = __ptr[uVar8 + 1];
      uVar3 = __ptr[uVar8 + 2];
      fprintf(__stream,"%5d %5d\n",(ulong)(uint)__ptr[uVar8 - 1],(ulong)(uint)__ptr[uVar8]);
      fprintf(__stream,"%5d %5d\n",(ulong)uVar7,(ulong)uVar3);
      fputc(10,__stream);
      iVar2 = (int)uVar8;
      uVar8 = uVar8 + 4;
    } while (iVar2 + 3 < iVar4);
LAB_0072dcb4:
    free(__ptr);
  }
  free(__ptr_00);
LAB_0072dcc7:
  fwrite("EOF\n",4,1,__stream);
  fputc(10,__stream);
  if (fShowImage == 0) {
    fwrite("# pause -1 \"Close window\"\n",0x1a,1,__stream);
    fwrite("# reset\n",8,1,__stream);
    fputc(10,__stream);
    fclose(__stream);
    return;
  }
  fwrite("pause -1 \"Close window\"\n",0x18,1,__stream);
  fwrite("reset\n",6,1,__stream);
  fputc(10,__stream);
  fclose(__stream);
  Gia_ManGnuplotShow(Buffer);
  return;
}

Assistant:

void Emb_ManDumpGnuplot( Emb_Man_t * p, char * pName, int fDumpLarge, int fShowImage )
{
    extern void Gia_ManGnuplotShow( char * pPlotFileName );
//    char * pDirectory = "place\\";
    char * pDirectory = "";
//    extern char * Ioa_TimeStamp();
    FILE * pFile;
    char Buffer[1000];
    Emb_Obj_t * pThis, * pNext;
    int i, k;
    if ( p->pPlacement == NULL )
    {
        printf( "Emb_ManDumpGnuplot(): Placement is not available.\n" );
        return;
    }
    sprintf( Buffer, "%s%s", pDirectory, Gia_FileNameGenericAppend(pName, ".plt") ); 
    pFile = fopen( Buffer, "w" );
    fprintf( pFile, "# This Gnuplot file was produced by ABC on %s\n", Ioa_TimeStamp() );
    fprintf( pFile, "\n" );
    fprintf( pFile, "set nokey\n" );
    fprintf( pFile, "\n" );
    if ( !fShowImage )
    {
//    fprintf( pFile, "set terminal postscript\n" );
    fprintf( pFile, "set terminal gif font \'arial\' 10 size 800,600 xffffff x000000 x000000 x000000\n" );
    fprintf( pFile, "set output \'%s\'\n", Gia_FileNameGenericAppend(pName, ".gif") );
    fprintf( pFile, "\n" );
    }
    fprintf( pFile, "set title \"%s :  PI = %d   PO = %d   FF = %d   Node = %d   Obj = %d  HPWL = %.2e\\n", 
        pName, Emb_ManPiNum(p), Emb_ManPoNum(p), Emb_ManRegNum(p), Emb_ManNodeNum(p), Emb_ManObjNum(p), Emb_ManComputeHPWL(p) );
    fprintf( pFile, "(image generated by ABC and Gnuplot on %s)\"", Ioa_TimeStamp() );
    fprintf( pFile, "font \"Times, 12\"\n" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "plot [:] '-' w l\n" );
    fprintf( pFile, "\n" );
    if ( fDumpLarge )
    {
        int begX, begY, endX, endY;
        Vec_Int_t * vLines = Emb_ManDumpGnuplotPrepare( p );
        Vec_IntForEachEntry( vLines, begX, i )
        {
            begY = Vec_IntEntry( vLines, i+1 );
            endX = Vec_IntEntry( vLines, i+2 );
            endY = Vec_IntEntry( vLines, i+3 );
            i += 3;
            fprintf( pFile, "%5d %5d\n", begX, begY );
            fprintf( pFile, "%5d %5d\n", endX, endY );
            fprintf( pFile, "\n" );
        }
        Vec_IntFree( vLines );
    }
    else
    {
        Emb_ManForEachObj( p, pThis, i )
        {
            if ( !Emb_ObjIsTravIdCurrent(p, pThis) )
                continue;
            Emb_ObjForEachFanout( pThis, pNext, k )
            {
                assert( Emb_ObjIsTravIdCurrent(p, pNext) );
                fprintf( pFile, "%5d %5d\n", p->pPlacement[2*pThis->Value+0], p->pPlacement[2*pThis->Value+1] );
                fprintf( pFile, "%5d %5d\n", p->pPlacement[2*pNext->Value+0], p->pPlacement[2*pNext->Value+1] );
                fprintf( pFile, "\n" );
            }
        }
    }
    fprintf( pFile, "EOF\n" );
    fprintf( pFile, "\n" );
    if ( fShowImage )
    {
    fprintf( pFile, "pause -1 \"Close window\"\n" );  // Hit return to continue
    fprintf( pFile, "reset\n" );
    fprintf( pFile, "\n" );
    }
    else
    {
    fprintf( pFile, "# pause -1 \"Close window\"\n" );  // Hit return to continue
    fprintf( pFile, "# reset\n" );
    fprintf( pFile, "\n" );
    }
    fclose( pFile );
    if ( fShowImage )
        Gia_ManGnuplotShow( Buffer );
}